

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O0

void __thiscall
QMainWindow::addDockWidget
          (QMainWindow *this,DockWidgetArea area,QDockWidget *dockwidget,Orientation orientation)

{
  bool bVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  QMainWindowLayout *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe0;
  Orientation orientation_00;
  undefined4 in_stack_fffffffffffffff0;
  DockWidgetArea area_00;
  
  area_00 = (DockWidgetArea)((ulong)in_RDI >> 0x20);
  bVar1 = checkDockWidgetArea((DockWidgetArea)in_RDX,
                              (char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  orientation_00 = (Orientation)((ulong)in_RDX >> 0x20);
  if (bVar1) {
    d_func((QMainWindow *)0x5ea5d2);
    QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5ea5e1);
    QMainWindowLayout::addDockWidget
              (unaff_retaddr,area_00,(QDockWidget *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
               orientation_00);
  }
  return;
}

Assistant:

void QMainWindow::addDockWidget(Qt::DockWidgetArea area, QDockWidget *dockwidget,
                                Qt::Orientation orientation)
{
    if (!checkDockWidgetArea(area, "QMainWindow::addDockWidget"))
        return;

    // add a window to an area, placing done relative to the previous
    d_func()->layout->addDockWidget(area, dockwidget, orientation);
}